

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_FabArrayBase.cpp
# Opt level: O2

void __thiscall amrex::FabArrayBase::RB180::define(RB180 *this,FabArrayBase *fa)

{
  int iVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  long lVar4;
  mapped_type *this_00;
  vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_> *this_01
  ;
  _Rb_tree_node_base *p_Var5;
  int iVar6;
  int ipass;
  int iVar7;
  Box *box;
  ulong uVar8;
  ulong uVar9;
  Box lhs;
  Rotate180Fn convert;
  int src_owner;
  vector<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_> isects;
  Box bxsnd;
  Box gbx;
  CopyComTag cct;
  int dst_owner;
  Box local_1b8;
  Rotate180Fn local_190;
  int local_18c;
  BoxArray *local_188;
  map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>
  *local_180;
  ulong local_178;
  int local_16c;
  undefined1 local_168 [16];
  pointer local_158;
  Box local_148;
  Box local_128;
  IntVect *local_100;
  ulong local_f8;
  map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>
  *local_f0;
  CopyComTag local_e8;
  Box local_a8;
  Box local_88;
  Box local_68;
  Box local_4c;
  
  local_18c = *(int *)(ParallelContext::frames + 0xc);
  local_158 = (pointer)0x0;
  local_168 = (undefined1  [16])0x0;
  local_88.bigend.vect[1] = (this->m_ngrow).vect[1];
  local_88.bigend.vect[0] = (this->m_domain).smallend.vect[0];
  iVar7 = (this->m_domain).smallend.vect[1];
  iVar6 = (this->m_domain).bigend.vect[1];
  local_88.smallend.vect[0] = local_88.bigend.vect[0] - (this->m_ngrow).vect[0];
  local_88.smallend.vect[1] = iVar7 - local_88.bigend.vect[1];
  local_88.bigend.vect[0] = local_88.bigend.vect[0] + -1;
  local_88.bigend.vect[1] = local_88.bigend.vect[1] + iVar6;
  local_88.btype.itype = (this->m_domain).btype.itype & 0xfffffffe;
  local_88.bigend.vect[2] = (this->m_ngrow).vect[2];
  local_88.smallend.vect[2] = (this->m_domain).smallend.vect[2] - local_88.bigend.vect[2];
  local_88.bigend.vect[2] = (this->m_domain).bigend.vect[2] + local_88.bigend.vect[2];
  local_188 = &fa->boxarray;
  uVar8 = (ulong)((long)(fa->indexArray).super_vector<int,_std::allocator<int>_>.
                        super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                 (long)(fa->indexArray).super_vector<int,_std::allocator<int>_>.
                       super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
                       ._M_start) >> 2;
  local_190.Ly = (iVar6 - iVar7) + 1;
  local_100 = &this->m_ngrow;
  NonLocalBC::Rotate180Fn::operator()(&local_a8,&local_190,&local_88);
  local_f0 = (this->super_CommMetaData).m_SndTags._M_t.
             super___uniq_ptr_impl<std::map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>,_std::default_delete<std::map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_std::map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>_*,_std::default_delete<std::map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>_>_>
             .
             super__Head_base<0UL,_std::map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>_*,_false>
             ._M_head_impl;
  local_f8 = uVar8 & 0xffffffff;
  if ((int)uVar8 < 1) {
    local_f8 = 0;
  }
  uVar8 = 0;
  while (uVar8 != local_f8) {
    iVar7 = (fa->indexArray).super_vector<int,_std::allocator<int>_>.
            super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
            [uVar8];
    local_178 = CONCAT44(local_178._4_4_,iVar7);
    BoxArray::operator[](&local_128,local_188,iVar7);
    for (lVar4 = 0; lVar4 != 2; lVar4 = lVar4 + 1) {
      iVar7 = local_128.smallend.vect[lVar4 + 1];
      if (iVar7 == (this->m_domain).smallend.vect[lVar4 + 1]) {
        local_128.smallend.vect[lVar4 + 1] = iVar7 - (this->m_ngrow).vect[lVar4 + 1];
      }
      iVar7 = local_128.bigend.vect[lVar4 + 1];
      if (iVar7 == (this->m_domain).bigend.vect[lVar4 + 1]) {
        local_128.bigend.vect[lVar4 + 1] = iVar7 + (this->m_ngrow).vect[lVar4 + 1];
      }
    }
    uVar9 = CONCAT44(-(uint)(local_a8.smallend.vect[1] < local_128.smallend.vect[1]),
                     -(uint)(local_a8.smallend.vect[0] < local_128.smallend.vect[0]));
    local_1b8.smallend.vect._0_8_ =
         ~uVar9 & local_a8.smallend.vect._0_8_ | local_128.smallend.vect._0_8_ & uVar9;
    local_1b8.smallend.vect[2] = local_a8.smallend.vect[2];
    if (local_a8.smallend.vect[2] < local_128.smallend.vect[2]) {
      local_1b8.smallend.vect[2] = local_128.smallend.vect[2];
    }
    uVar9 = CONCAT44(-(uint)(local_128.bigend.vect[1] < local_a8.bigend.vect[1]),
                     -(uint)(local_128.bigend.vect[0] < local_a8.bigend.vect[0]));
    uVar9 = ~uVar9 & local_a8.bigend.vect._0_8_ |
            CONCAT44(local_128.bigend.vect[1],local_128.bigend.vect[0]) & uVar9;
    local_1b8.bigend.vect[0] = (int)uVar9;
    local_1b8.bigend.vect[1] = (int)(uVar9 >> 0x20);
    local_1b8.bigend.vect[2] = local_128.bigend.vect[2];
    iVar7 = local_a8.bigend.vect[2];
    if (local_1b8.bigend.vect[2] < local_a8.bigend.vect[2]) {
      iVar7 = local_1b8.bigend.vect[2];
    }
    local_1b8.btype.itype = local_128.btype.itype;
    local_1b8.bigend.vect[2] = iVar7;
    local_180 = (map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>
                 *)uVar8;
    NonLocalBC::Rotate180Fn::operator()(&local_4c,&local_190,&local_1b8);
    if (((local_1b8.smallend.vect[0] <= local_1b8.bigend.vect[0]) &&
        (local_1b8.smallend.vect[1] <= local_1b8.bigend.vect[1])) &&
       ((local_1b8.smallend.vect[2] <= local_1b8.bigend.vect[2] && (local_1b8.btype.itype < 8)))) {
      BoxArray::intersections
                (local_188,&local_4c,
                 (vector<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_> *
                 )local_168,false,local_100);
      uVar8 = (ulong)(local_168._8_8_ - local_168._0_8_) >> 5;
      uVar9 = uVar8 & 0xffffffff;
      if ((int)uVar8 < 1) {
        uVar9 = 0;
      }
      for (lVar4 = 0; uVar9 * 0x20 != lVar4; lVar4 = lVar4 + 0x20) {
        uVar3 = local_168._0_8_;
        iVar7 = *(int *)((long)(((Box *)(local_168._0_8_ + 4))->smallend).vect + lVar4 + -4);
        local_68.smallend.vect[0] =
             *(int *)(*(long *)&(((fa->distributionMap).m_ref.
                                  super___shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_ptr)->m_pmap).super_vector<int,_std::allocator<int>_>.
                                super__Vector_base<int,_std::allocator<int>_>._M_impl +
                     (long)iVar7 * 4);
        if (local_68.smallend.vect[0] != local_18c) {
          box = (Box *)((long)(((Box *)(local_168._0_8_ + 4))->smallend).vect + lVar4);
          NonLocalBC::Rotate180Fn::operator()(&local_148,&local_190,box);
          this_00 = std::
                    map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>
                    ::operator[](local_f0,(key_type *)&local_68);
          local_e8.dbox.smallend.vect._0_8_ = *(undefined8 *)(box->smallend).vect;
          uVar2 = *(undefined8 *)((long)(((Box *)(uVar3 + 4))->smallend).vect + lVar4 + 8);
          local_e8.dbox._20_8_ =
               *(undefined8 *)((long)(((Box *)(uVar3 + 4))->bigend).vect + lVar4 + 8);
          local_e8.dbox.bigend.vect[1] =
               (int)((ulong)*(undefined8 *)((long)(((Box *)(uVar3 + 4))->bigend).vect + lVar4) >>
                    0x20);
          local_e8.dbox.smallend.vect[2] = (int)uVar2;
          local_e8.dbox.bigend.vect[0] = (int)((ulong)uVar2 >> 0x20);
          local_e8.sbox.bigend.vect[1] = local_148.bigend.vect[1];
          local_e8.sbox.bigend.vect[2] = local_148.bigend.vect[2];
          local_e8.sbox.btype.itype = local_148.btype.itype;
          local_e8.sbox.smallend.vect[0] = local_148.smallend.vect[0];
          local_e8.sbox.smallend.vect[1] = local_148.smallend.vect[1];
          local_e8.sbox.smallend.vect[2] = local_148.smallend.vect[2];
          local_e8.sbox.bigend.vect[0] = local_148.bigend.vect[0];
          local_e8.srcIndex = (int)local_178;
          local_e8.dstIndex = iVar7;
          std::
          vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>
          ::emplace_back<amrex::FabArrayBase::CopyComTag>(this_00,&local_e8);
        }
      }
    }
    uVar8 = (long)local_180 + 1;
  }
  local_180 = (this->super_CommMetaData).m_RcvTags._M_t.
              super___uniq_ptr_impl<std::map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>,_std::default_delete<std::map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>_*,_std::default_delete<std::map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>_>_>
              .
              super__Head_base<0UL,_std::map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>_*,_false>
              ._M_head_impl;
  uVar8 = 0;
  while (uVar8 != local_f8) {
    iVar7 = (fa->indexArray).super_vector<int,_std::allocator<int>_>.
            super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
            [uVar8];
    local_178 = uVar8;
    BoxArray::operator[](&local_e8.dbox,local_188,iVar7);
    local_128.bigend.vect[1] = local_e8.dbox.bigend.vect[1];
    local_128.bigend.vect[2] = local_e8.dbox.bigend.vect[2];
    local_128.btype.itype = local_e8.dbox.btype.itype;
    local_128.smallend.vect[0] = local_e8.dbox.smallend.vect[0];
    local_128.smallend.vect[1] = local_e8.dbox.smallend.vect[1];
    local_128.smallend.vect[2] = local_e8.dbox.smallend.vect[2];
    local_128.bigend.vect[0] = local_e8.dbox.bigend.vect[0];
    Box::grow(&local_128,local_100);
    uVar8 = CONCAT44(-(uint)(local_88.smallend.vect[1] < local_128.smallend.vect[1]),
                     -(uint)(local_88.smallend.vect[0] < local_128.smallend.vect[0]));
    local_1b8.smallend.vect._0_8_ =
         ~uVar8 & CONCAT44(local_88.smallend.vect[1],local_88.smallend.vect[0]) |
         local_128.smallend.vect._0_8_ & uVar8;
    local_1b8.smallend.vect[2] = local_88.smallend.vect[2];
    if (local_88.smallend.vect[2] < local_128.smallend.vect[2]) {
      local_1b8.smallend.vect[2] = local_128.smallend.vect[2];
    }
    uVar8 = CONCAT44(-(uint)(local_128.bigend.vect[1] < local_88.bigend.vect[1]),
                     -(uint)(local_128.bigend.vect[0] < local_88.bigend.vect[0]));
    uVar8 = ~uVar8 & CONCAT44(local_88.bigend.vect[1],local_88.bigend.vect[0]) |
            CONCAT44(local_128.bigend.vect[1],local_128.bigend.vect[0]) & uVar8;
    local_1b8.bigend.vect[0] = (int)uVar8;
    local_1b8.bigend.vect[1] = (int)(uVar8 >> 0x20);
    local_1b8.bigend.vect[2] = local_128.bigend.vect[2];
    iVar6 = local_88.bigend.vect[2];
    if (local_1b8.bigend.vect[2] < local_88.bigend.vect[2]) {
      iVar6 = local_1b8.bigend.vect[2];
    }
    local_1b8.btype.itype = local_128.btype.itype;
    local_1b8.bigend.vect[2] = iVar6;
    NonLocalBC::Rotate180Fn::operator()(&local_4c,&local_190,&local_1b8);
    if ((((local_1b8.smallend.vect[0] <= local_1b8.bigend.vect[0]) &&
         (local_1b8.smallend.vect[1] <= local_1b8.bigend.vect[1])) &&
        (local_1b8.smallend.vect[2] <= local_1b8.bigend.vect[2])) && (local_1b8.btype.itype < 8)) {
      BoxArray::intersections
                (local_188,&local_4c,
                 (vector<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_> *
                 )local_168);
      uVar8 = (ulong)(local_168._8_8_ - local_168._0_8_) >> 5;
      uVar9 = uVar8 & 0xffffffff;
      if ((int)uVar8 < 1) {
        uVar9 = 0;
      }
      for (uVar8 = 0; uVar8 != uVar9; uVar8 = uVar8 + 1) {
        iVar6 = ((pointer)(local_168._0_8_ + uVar8 * 0x20))->first;
        local_148.smallend.vect._0_8_ =
             *(undefined8 *)(((pointer)(local_168._0_8_ + uVar8 * 0x20))->second).smallend.vect;
        uVar3 = *(undefined8 *)
                 ((((pointer)(local_168._0_8_ + uVar8 * 0x20))->second).smallend.vect + 2);
        local_148.bigend.vect[1] =
             (int)((ulong)*(undefined8 *)
                           (((pointer)(local_168._0_8_ + uVar8 * 0x20))->second).bigend.vect >> 0x20
                  );
        local_148._20_8_ =
             *(undefined8 *)((((pointer)(local_168._0_8_ + uVar8 * 0x20))->second).bigend.vect + 2);
        local_148.smallend.vect[2] = (int)uVar3;
        local_148.bigend.vect[0] = (int)((ulong)uVar3 >> 0x20);
        for (lVar4 = 0; lVar4 != 2; lVar4 = lVar4 + 1) {
          iVar1 = local_148.smallend.vect[lVar4 + 1];
          if (iVar1 == (this->m_domain).smallend.vect[lVar4 + 1]) {
            local_148.smallend.vect[lVar4 + 1] = iVar1 - (this->m_ngrow).vect[lVar4 + 1];
          }
          iVar1 = local_148.bigend.vect[lVar4 + 1];
          if (iVar1 == (this->m_domain).bigend.vect[lVar4 + 1]) {
            local_148.bigend.vect[lVar4 + 1] = iVar1 + (this->m_ngrow).vect[lVar4 + 1];
          }
        }
        NonLocalBC::Rotate180Fn::operator()(&local_68,&local_190,&local_148);
        local_16c = *(int *)(*(long *)&(((fa->distributionMap).m_ref.
                                         super___shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>
                                        ._M_ptr)->m_pmap).super_vector<int,_std::allocator<int>_>.
                                       super__Vector_base<int,_std::allocator<int>_>._M_impl +
                            (long)iVar6 * 4);
        local_e8.dbox.smallend.vect._0_8_ =
             CONCAT44(local_68.smallend.vect[1],local_68.smallend.vect[0]);
        local_e8.dbox.bigend.vect[1] = local_68.bigend.vect[1];
        local_e8.dbox.bigend.vect[2] = local_68.bigend.vect[2];
        local_e8.dbox.btype.itype = local_68.btype.itype;
        local_e8.dbox.smallend.vect[2] = local_68.smallend.vect[2];
        local_e8.dbox.bigend.vect[0] = local_68.bigend.vect[0];
        local_e8.sbox.bigend.vect[1] = local_148.bigend.vect[1];
        local_e8.sbox.bigend.vect[2] = local_148.bigend.vect[2];
        local_e8.sbox.btype.itype = local_148.btype.itype;
        local_e8.sbox.smallend.vect[0] = local_148.smallend.vect[0];
        local_e8.sbox.smallend.vect[1] = local_148.smallend.vect[1];
        local_e8.sbox.smallend.vect[2] = local_148.smallend.vect[2];
        local_e8.sbox.bigend.vect[0] = local_148.bigend.vect[0];
        local_e8.dstIndex = iVar7;
        local_e8.srcIndex = iVar6;
        if (local_16c == local_18c) {
          this_01 = (this->super_CommMetaData).m_LocTags._M_t.
                    super___uniq_ptr_impl<std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::default_delete<std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_*,_std::default_delete<std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>
                    .
                    super__Head_base<0UL,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_*,_false>
                    ._M_head_impl;
        }
        else {
          this_01 = std::
                    map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>
                    ::operator[](local_180,&local_16c);
        }
        std::
        vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>::
        push_back(this_01,&local_e8);
      }
    }
    uVar8 = local_178 + 1;
  }
  for (iVar7 = 0; iVar7 != 2; iVar7 = iVar7 + 1) {
    lVar4 = *(long *)((this->m_ngrow).vect + (ulong)(iVar7 != 0) * 2 + -4);
    for (p_Var5 = *(_Rb_tree_node_base **)(lVar4 + 0x18);
        p_Var5 != (_Rb_tree_node_base *)(lVar4 + 8);
        p_Var5 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var5)) {
      std::
      __sort<__gnu_cxx::__normal_iterator<amrex::FabArrayBase::CopyComTag*,std::vector<amrex::FabArrayBase::CopyComTag,std::allocator<amrex::FabArrayBase::CopyComTag>>>,__gnu_cxx::__ops::_Iter_less_iter>
                (p_Var5[1]._M_parent,p_Var5[1]._M_left);
    }
  }
  std::_Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>::
  ~_Vector_base((_Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>
                 *)local_168);
  return;
}

Assistant:

void
FabArrayBase::RB180::define (const FabArrayBase& fa)
{
    const int myproc = ParallelDescriptor::MyProc();
    const BoxArray& ba = fa.boxArray();
    const DistributionMapping& dm = fa.DistributionMap();
    const Vector<int>& imap = fa.IndexArray();

    const int nlocal = imap.size();
    std::vector<std::pair<int,Box> > isects;

    Box domain_dst = amrex::adjCellLo(m_domain, 0, m_ngrow[0]).grow(1, m_ngrow[1]);
#if (AMREX_SPACEDIM == 3)
    domain_dst.grow(2, m_ngrow[2]);
#endif

    auto const convert = NonLocalBC::Rotate180Fn{m_domain.length(1)};

    Box const& domain_src = convert(domain_dst);

    auto& send_tags = *m_SndTags;

    for (int i = 0; i < nlocal; ++i)
    {
        const int ksnd = imap[i];
        Box gbx = ba[ksnd];
        for (int idim = 1; idim < AMREX_SPACEDIM; ++idim) {
            if (gbx.smallEnd(idim) == m_domain.smallEnd(idim)) {
                gbx.growLo(idim, m_ngrow[idim]);
            }
            if (gbx.bigEnd(idim) == m_domain.bigEnd(idim)) {
                gbx.growHi(idim, m_ngrow[idim]);
            }
        }

        Box const& src_box = gbx & domain_src;
        Box const& dst_box = convert(src_box);

        if (src_box.ok()) {
            ba.intersections(dst_box, isects, false, m_ngrow);
            for (int j = 0, M = isects.size(); j < M; ++j) {
                const int krcv = isects[j].first;
                const Box& bxrcv = isects[j].second;
                const int dst_owner = dm[krcv];
                if (dst_owner != myproc) // local copy will be dealt with later
                {
                    Box const& bxsnd = convert(bxrcv);
                    send_tags[dst_owner].push_back(FabArrayBase::CopyComTag(bxrcv, bxsnd,
                                                                            krcv, ksnd));
                }
            }
        }
    }

    auto& recv_tags = *m_RcvTags;

    for (int i = 0; i < nlocal; ++i)
    {
        const int krcv = imap[i];
        Box const& gbx = amrex::grow(ba[krcv],m_ngrow);

        Box const& dst_box = gbx & domain_dst;
        Box const& src_box = convert(dst_box);

        if (dst_box.ok()) {
            ba.intersections(src_box, isects);
            for (int j = 0, M = isects.size(); j < M; ++j) {
                const int ksnd = isects[j].first;
                Box bxsnd = isects[j].second;
                // the ghost cells at lo-y, hi-y, lo-z, and hi-z
                // boundaries are also the source
                for (int idim = 1; idim < AMREX_SPACEDIM; ++idim) {
                    if (bxsnd.smallEnd(idim) == m_domain.smallEnd(idim)) {
                        bxsnd.growLo(idim, m_ngrow[idim]);
                    }
                    if (bxsnd.bigEnd(idim) == m_domain.bigEnd(idim)) {
                        bxsnd.growHi(idim, m_ngrow[idim]);
                    }
                }
                Box const& bxrcv = convert(bxsnd);
                const int src_owner = dm[ksnd];
                FabArrayBase::CopyComTag cct(bxrcv, bxsnd, krcv, ksnd);
                if (src_owner == myproc) {
                    m_LocTags->push_back(cct);
                } else {
                    recv_tags[src_owner].push_back(cct);
                }
            }
        }
    }

    for (int ipass = 0; ipass < 2; ++ipass) // pass 0: send; pass 1: recv
    {
        auto& Tags = (ipass == 0) ? *m_SndTags : *m_RcvTags;
        for (auto& kv : Tags)
        {
            auto& cctv = kv.second;
            // We need to fix the order so that the send and recv processes match.
            std::sort(cctv.begin(), cctv.end());
        }
    }
}